

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool run_test_type_conversion<std::shared_ptr<double>const>(Boxed_Value *bv,bool expectedpass)

{
  bad_boxed_cast *e;
  exception *e_1;
  undefined1 local_30 [8];
  shared_ptr<double> ret;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  ret.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = expectedpass;
  chaiscript::boxed_cast<std::shared_ptr<double>const>
            ((chaiscript *)local_30,bv,(Type_Conversions_State *)0x0);
  std::shared_ptr<double>::shared_ptr((shared_ptr<double> *)&e_1,(shared_ptr<double> *)local_30);
  use<std::shared_ptr<double>>((shared_ptr<double> *)&e_1);
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)&e_1);
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_30);
  return (bool)(ret.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ &
               1);
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}